

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O2

void __thiscall bal::GraphMLStreamWriter::write_footer(GraphMLStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,"</graph>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,"</graphml>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void write_footer(const Cnf& value) {
            stream() << "</graph>" << std::endl;
            stream() << "</graphml>" << std::endl;
        }